

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse(parser *this,char *s)

{
  allocator local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream i;
  char *s_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,s,&local_1b9);
  std::__cxx11::istringstream::istringstream(local_198,local_1b8,8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  parse(this,(istream *)local_198);
  std::__cxx11::istringstream::~istringstream(local_198);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse(const char *s)
{
    istringstream i(s);
    return parse(i);
}